

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_wif_trace.cpp
# Opt level: O0

void __thiscall
sc_core::wif_enum_trace::print_variable_declaration_line(wif_enum_trace *this,FILE *f)

{
  undefined8 uVar1;
  undefined8 uVar2;
  FILE *in_RSI;
  long in_RDI;
  uint i;
  uint local_14;
  
  fprintf(in_RSI,"type scalar \"%s\" enum ",*(undefined8 *)(in_RDI + 0x48));
  for (local_14 = 0; local_14 < *(uint *)(in_RDI + 0x70); local_14 = local_14 + 1) {
    fprintf(in_RSI,"\"%s\", ",*(undefined8 *)(*(long *)(in_RDI + 0x68) + (ulong)local_14 * 8));
  }
  fprintf(in_RSI,"\"SC_WIF_UNDEF\" ;\n");
  uVar1 = std::__cxx11::string::c_str();
  uVar2 = std::__cxx11::string::c_str();
  fprintf(in_RSI,"declare  %s   \"%s\"  \"%s\" ",uVar1,uVar2,*(undefined8 *)(in_RDI + 0x48));
  fprintf(in_RSI,"variable ;\n");
  uVar1 = std::__cxx11::string::c_str();
  fprintf(in_RSI,"start_trace %s ;\n",uVar1);
  return;
}

Assistant:

void wif_enum_trace::print_variable_declaration_line(FILE* f)
{
    std::fprintf(f, "type scalar \"%s\" enum ", wif_type);

    for (unsigned i = 0; i < nliterals; i++)
      std::fprintf(f, "\"%s\", ", literals[i]);
    std::fprintf(f, "\"SC_WIF_UNDEF\" ;\n");

    std::fprintf(f, "declare  %s   \"%s\"  \"%s\" ",
	    wif_name.c_str(), name.c_str(), wif_type);
    std::fprintf(f, "variable ;\n");
    std::fprintf(f, "start_trace %s ;\n", wif_name.c_str());
}